

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
::
emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>
          (flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_> *args_1
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 auVar3 [12];
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
  pVar4;
  value_type val;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
  local_50;
  
  paVar1 = &local_50.first.field_2;
  pcVar2 = (args->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + args->_M_string_length);
  local_50.second =
       (unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>)
       (args_1->_M_t).
       super___uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>
       ._M_t.
       super__Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>
       .super__Head_base<0UL,_Rml::VariableDefinition_*,_false>._M_head_impl;
  (args_1->_M_t).
  super___uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>._M_t
  .super__Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>.
  super__Head_base<0UL,_Rml::VariableDefinition_*,_false>._M_head_impl = (VariableDefinition *)0x0;
  pVar4 = insert<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>
                    (this,&local_50);
  if ((_Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>)
      local_50.second._M_t.
      super___uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>.
      _M_t.
      super__Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>
      .super__Head_base<0UL,_Rml::VariableDefinition_*,_false>._M_head_impl !=
      (VariableDefinition *)0x0) {
    (**(code **)(*(long *)local_50.second._M_t.
                          super___uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>
                          .super__Head_base<0UL,_Rml::VariableDefinition_*,_false>._M_head_impl + 8)
    )();
  }
  local_50.second._M_t.
  super___uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>._M_t
  .super__Tuple_impl<0UL,_Rml::VariableDefinition_*,_std::default_delete<Rml::VariableDefinition>_>.
  super__Head_base<0UL,_Rml::VariableDefinition_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>,_true,_true>
        )(__uniq_ptr_impl<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>)
         0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  auVar3 = pVar4._0_12_;
  pVar4._12_4_ = 0;
  pVar4.first._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        *)auVar3._0_8_;
  pVar4.second = (bool)auVar3[8];
  pVar4._9_3_ = auVar3._9_3_;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args)
    {
        value_type val(std::forward<Args>(args)...);
        return insert(std::move(val));
    }